

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.cpp
# Opt level: O2

void __thiscall Diligent::DeviceContextVkImpl::CommitViewports(DeviceContextVkImpl *this)

{
  float fVar1;
  float fVar2;
  ulong uVar3;
  long lVar4;
  VkViewport VkViewports [16];
  VkViewport local_188 [16];
  
  uVar3 = (ulong)(this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                 super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_NumViewports;
  if (uVar3 != 0) {
    for (lVar4 = 0; uVar3 * 0x18 - lVar4 != 0; lVar4 = lVar4 + 0x18) {
      *(undefined4 *)((long)&local_188[0].x + lVar4) =
           *(undefined4 *)
            ((long)&(this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                    super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_Viewports[0].TopLeftX +
            lVar4);
      fVar1 = *(float *)((long)&(this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>)
                                .super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_Viewports
                                [0].TopLeftY + lVar4);
      *(undefined4 *)((long)&local_188[0].width + lVar4) =
           *(undefined4 *)
            ((long)&(this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                    super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_Viewports[0].Width +
            lVar4);
      fVar2 = *(float *)((long)&(this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>)
                                .super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_Viewports
                                [0].Height + lVar4);
      *(undefined8 *)((long)&local_188[0].minDepth + lVar4) =
           *(undefined8 *)
            ((long)&(this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                    super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_Viewports[0].MinDepth +
            lVar4);
      *(float *)((long)&local_188[0].y + lVar4) = fVar1 + fVar2;
      *(float *)((long)&local_188[0].height + lVar4) = -fVar2;
    }
    EnsureVkCmdBuffer(this);
    VulkanUtilities::VulkanCommandBuffer::SetViewports
              (&this->m_CommandBuffer,0,
               (this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
               super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_NumViewports,local_188);
  }
  return;
}

Assistant:

void DeviceContextVkImpl::CommitViewports()
{
    if (m_NumViewports == 0)
        return;

    VkViewport VkViewports[MAX_VIEWPORTS]; // Do not waste time initializing array to zero
    for (Uint32 vp = 0; vp < m_NumViewports; ++vp)
    {
        VkViewports[vp].x        = m_Viewports[vp].TopLeftX;
        VkViewports[vp].y        = m_Viewports[vp].TopLeftY;
        VkViewports[vp].width    = m_Viewports[vp].Width;
        VkViewports[vp].height   = m_Viewports[vp].Height;
        VkViewports[vp].minDepth = m_Viewports[vp].MinDepth;
        VkViewports[vp].maxDepth = m_Viewports[vp].MaxDepth;

        // Turn the viewport upside down to be consistent with Direct3D. Note that in both APIs,
        // the viewport covers the same texture rows. The difference is that Direct3D inverts
        // normalized device Y coordinate when transforming NDC to window coordinates. In Vulkan
        // we achieve the same effect by using negative viewport height. Therefore we need to
        // invert normalized device Y coordinate when transforming to texture V
        //
        //
        //       Image                Direct3D                                       Image               Vulkan
        //        row                                                                 row
        //         0 _   (0,0)_______________________(1,0)                  Tex Height _   (0,1)_______________________(1,1)
        //         1 _       |                       |      |             VP Top + Hght _ _ _ _|   __________          |      A
        //         2 _       |                       |      |                          .       |  |   .--> +x|         |      |
        //           .       |                       |      |                          .       |  |   |      |         |      |
        //           .       |                       |      | V Coord                          |  |   V +y   |         |      | V Coord
        //     VP Top _ _ _ _|   __________          |      |                    VP Top _ _ _ _|  |__________|         |      |
        //           .       |  |    A +y  |         |      |                          .       |                       |      |
        //           .       |  |    |     |         |      |                          .       |                       |      |
        //           .       |  |    '-->+x|         |      |                        2 _       |                       |      |
        //           .       |  |__________|         |      |                        1 _       |                       |      |
        //Tex Height _       |_______________________|      V                        0 _       |_______________________|      |
        //               (0,1)                       (1,1)                                 (0,0)                       (1,0)
        //
        //

        VkViewports[vp].y      = VkViewports[vp].y + VkViewports[vp].height;
        VkViewports[vp].height = -VkViewports[vp].height;
    }
    EnsureVkCmdBuffer();
    // TODO: reinterpret_cast m_Viewports to VkViewports?
    m_CommandBuffer.SetViewports(0, m_NumViewports, VkViewports);
}